

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
             *this,longdouble value)

{
  long in_RSI;
  type *in_RDI;
  unkbyte10 in_stack_00000008;
  format_specs *in_stack_000002b8;
  longdouble in_stack_000002c0;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *in_stack_000002d0;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 uVar1;
  undefined6 in_stack_ffffffffffffffa2;
  
  if (*(long *)(in_RSI + 0x28) == 0) {
    basic_format_specs<wchar_t>::basic_format_specs
              ((basic_format_specs<wchar_t> *)
               CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0));
  }
  uVar1 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  ::write_double<long_double>(in_stack_000002d0,in_stack_000002c0,in_stack_000002b8);
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  ::out((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
         *)CONCAT62(in_stack_ffffffffffffffa2,uVar1));
  return in_RDI;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }